

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeLast(BtCursor *pCur,int *pRes)

{
  int local_24;
  int rc;
  int *pRes_local;
  BtCursor *pCur_local;
  
  if ((pCur->eState == '\x01') && ((pCur->curFlags & 8) != 0)) {
    pCur_local._4_4_ = 0;
  }
  else {
    local_24 = moveToRoot(pCur);
    if (local_24 == 0) {
      if (pCur->eState == '\0') {
        *pRes = 1;
      }
      else {
        *pRes = 0;
        local_24 = moveToRightmost(pCur);
        if (local_24 == 0) {
          pCur->curFlags = pCur->curFlags | 8;
        }
        else {
          pCur->curFlags = pCur->curFlags & 0xf7;
        }
      }
    }
    pCur_local._4_4_ = local_24;
  }
  return pCur_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeLast(BtCursor *pCur, int *pRes){
  int rc;
 
  assert( cursorOwnsBtShared(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );

  /* If the cursor already points to the last entry, this is a no-op. */
  if( CURSOR_VALID==pCur->eState && (pCur->curFlags & BTCF_AtLast)!=0 ){
#ifdef SQLITE_DEBUG
    /* This block serves to assert() that the cursor really does point 
    ** to the last entry in the b-tree. */
    int ii;
    for(ii=0; ii<pCur->iPage; ii++){
      assert( pCur->aiIdx[ii]==pCur->apPage[ii]->nCell );
    }
    assert( pCur->aiIdx[pCur->iPage]==pCur->apPage[pCur->iPage]->nCell-1 );
    assert( pCur->apPage[pCur->iPage]->leaf );
#endif
    return SQLITE_OK;
  }

  rc = moveToRoot(pCur);
  if( rc==SQLITE_OK ){
    if( CURSOR_INVALID==pCur->eState ){
      assert( pCur->pgnoRoot==0 || pCur->apPage[pCur->iPage]->nCell==0 );
      *pRes = 1;
    }else{
      assert( pCur->eState==CURSOR_VALID );
      *pRes = 0;
      rc = moveToRightmost(pCur);
      if( rc==SQLITE_OK ){
        pCur->curFlags |= BTCF_AtLast;
      }else{
        pCur->curFlags &= ~BTCF_AtLast;
      }
   
    }
  }
  return rc;
}